

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

Expression * wasm::Bits::makeSignExt(Expression *value,Index bytes,Module *wasm)

{
  uintptr_t uVar1;
  Expression *pEVar2;
  Binary *this;
  MixedArena *pMVar3;
  int x;
  BinaryOp BVar4;
  uint x_00;
  Literal local_48;
  
  uVar1 = (value->type).id;
  if (uVar1 == 3) {
    switch(bytes) {
    case 1:
      x_00 = 0x38;
      break;
    case 2:
    case 4:
      x_00 = (uint)(bytes == 2) << 4 | 0x20;
      break;
    default:
      __assert_fail("bytes == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                    ,0x69,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    case 8:
      goto switchD_00639028_caseD_8;
    }
    pMVar3 = &wasm->allocator;
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar3,0x28,8);
    pEVar2->_id = ConstId;
    (pEVar2->type).id = 0;
    *(undefined8 *)(pEVar2 + 1) = 0;
    pEVar2[1].type.id = 0;
    *(undefined8 *)(pEVar2 + 2) = 0;
    Literal::makeFromInt32(&local_48,x_00,(Type)0x3);
    Literal::operator=((Literal *)(pEVar2 + 1),&local_48);
    Literal::~Literal(&local_48);
    (pEVar2->type).id = 3;
    this = (Binary *)MixedArena::allocSpace(pMVar3,0x28,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this->op = ShlInt64;
    this->left = value;
    this->right = pEVar2;
    Binary::finalize(this);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar3,0x28,8);
    pEVar2->_id = ConstId;
    (pEVar2->type).id = 0;
    *(undefined8 *)(pEVar2 + 1) = 0;
    pEVar2[1].type.id = 0;
    *(undefined8 *)(pEVar2 + 2) = 0;
    Literal::makeFromInt32(&local_48,x_00,(Type)0x3);
    Literal::operator=((Literal *)(pEVar2 + 1),&local_48);
    Literal::~Literal(&local_48);
    (pEVar2->type).id = 3;
    BVar4 = ShrSInt64;
  }
  else {
    if (uVar1 != 2) {
      __assert_fail("value->type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                    ,0x5d,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
    if (1 < bytes - 1) {
      if (bytes == 4) {
        return value;
      }
      __assert_fail("bytes == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                    ,0x5a,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
    x = (uint)(bytes == 1) * 8 + 0x10;
    pMVar3 = &wasm->allocator;
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar3,0x28,8);
    pEVar2->_id = ConstId;
    (pEVar2->type).id = 0;
    *(undefined8 *)(pEVar2 + 1) = 0;
    pEVar2[1].type.id = 0;
    *(undefined8 *)(pEVar2 + 2) = 0;
    Literal::makeFromInt32(&local_48,x,(Type)0x2);
    Literal::operator=((Literal *)(pEVar2 + 1),&local_48);
    Literal::~Literal(&local_48);
    (pEVar2->type).id = 2;
    this = (Binary *)MixedArena::allocSpace(pMVar3,0x28,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this->op = ShlInt32;
    this->left = value;
    this->right = pEVar2;
    Binary::finalize(this);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar3,0x28,8);
    pEVar2->_id = ConstId;
    (pEVar2->type).id = 0;
    *(undefined8 *)(pEVar2 + 1) = 0;
    pEVar2[1].type.id = 0;
    *(undefined8 *)(pEVar2 + 2) = 0;
    Literal::makeFromInt32(&local_48,x,(Type)0x2);
    Literal::operator=((Literal *)(pEVar2 + 1),&local_48);
    Literal::~Literal(&local_48);
    (pEVar2->type).id = 2;
    BVar4 = ShrSInt32;
  }
  value = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x28,8);
  (((Binary *)value)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
       BinaryId;
  (((Binary *)value)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
       0;
  ((Binary *)value)->op = BVar4;
  ((Binary *)value)->left = (Expression *)this;
  ((Binary *)value)->right = pEVar2;
  Binary::finalize((Binary *)value);
switchD_00639028_caseD_8:
  return (Expression *)(Binary *)value;
}

Assistant:

inline Expression* makeSignExt(Expression* value, Index bytes, Module& wasm) {
  if (value->type == Type::i32) {
    if (bytes == 1 || bytes == 2) {
      auto shifts = bytes == 1 ? 24 : 16;
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt32,
        builder.makeBinary(
          ShlInt32,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i32, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i32, wasm));
    }
    assert(bytes == 4);
    return value; // nothing to do
  } else {
    assert(value->type == Type::i64);
    if (bytes == 1 || bytes == 2 || bytes == 4) {
      auto shifts = bytes == 1 ? 56 : (bytes == 2 ? 48 : 32);
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt64,
        builder.makeBinary(
          ShlInt64,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i64, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i64, wasm));
    }
    assert(bytes == 8);
    return value; // nothing to do
  }
}